

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void PaUtil_SetInterleavedInputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint uVar1;
  ulong uVar2;
  PaUtilChannelDescriptor *pPVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = bp->inputChannelCount;
  uVar2 = (ulong)channelCount;
  if (channelCount == 0) {
    uVar2 = (ulong)uVar1;
  }
  if (uVar1 <= firstChannel) {
    __assert_fail("firstChannel < bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                  ,0x1e1,
                  "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (uVar1 < (uint)uVar2 + firstChannel) {
    __assert_fail("firstChannel + channelCount <= bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                  ,0x1e2,
                  "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->hostInputIsInterleaved != 0) {
    uVar1 = bp->bytesPerHostInputSample;
    pPVar3 = bp->hostInputChannels[0];
    uVar4 = 0;
    do {
      uVar5 = firstChannel + (int)uVar4;
      pPVar3[uVar5].data = data;
      data = (void *)((long)data + (ulong)uVar1);
      pPVar3 = bp->hostInputChannels[0];
      pPVar3[uVar5].stride = (uint)uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    return;
  }
  __assert_fail("bp->hostInputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                ,0x1e3,
                "void PaUtil_SetInterleavedInputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_SetInterleavedInputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->inputChannelCount;

    assert( firstChannel < bp->inputChannelCount );
    assert( firstChannel + channelCount <= bp->inputChannelCount );
    assert( bp->hostInputIsInterleaved );

    for( i=0; i< channelCount; ++i )
    {
        bp->hostInputChannels[0][channel+i].data = p;
        p += bp->bytesPerHostInputSample;
        bp->hostInputChannels[0][channel+i].stride = channelCount;
    }
}